

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::GetBytesDefaultValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  string local_58;
  long *local_38;
  long local_30;
  long local_28;
  long lStack_20;
  
  if ((*(string **)(descriptor + 0x90))->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"pb::ByteString.Empty","");
  }
  else {
    StringToBase64(&local_58,*(string **)(descriptor + 0x90));
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x2a29fb);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_28 = *plVar3;
      lStack_20 = plVar2[3];
      local_38 = &local_28;
    }
    else {
      local_28 = *plVar3;
      local_38 = (long *)*plVar2;
    }
    local_30 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_38);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar4) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_38 != &local_28) {
      operator_delete(local_38);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::GetBytesDefaultValueInternal(const FieldDescriptor* descriptor) {
    if (descriptor->default_value_string().empty())
        return "pb::ByteString.Empty";
    else
        return "pb::ByteString.FromBase64(\"" + StringToBase64(descriptor->default_value_string()) + "\")";
}